

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O2

void __thiscall fs_tests::fsbridge_pathtostring::test_method(fsbridge_pathtostring *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar5;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  string local_100;
  undefined1 local_e0 [40];
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined8 local_a0;
  string invalid_u8_str;
  u8string str8;
  string u8_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&u8_str,anon_var_dwarf_6e376f,(allocator<char> *)local_e0);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            ((u8string *)&str8,anon_var_dwarf_6e376f,(allocator<char8_t> *)local_e0);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x15;
  file.m_begin = (iterator)&local_110;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_120,msg);
  invalid_u8_str._M_string_length._0_1_ = 0;
  invalid_u8_str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_128 = "";
  fs::PathFromString((path *)local_e0,&u8_str);
  std::filesystem::__cxx11::path::string((string *)local_b8,(path *)local_e0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&invalid_u8_str,&local_130,0x15,1,2,pvVar4,
             "fs::PathToString(fs::PathFromString(u8_str))",&u8_str,"u8_str");
  std::__cxx11::string::~string((string *)local_b8);
  std::filesystem::__cxx11::path::~path((path *)local_e0);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x16;
  file_00.m_begin = (iterator)&local_140;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
             msg_00);
  invalid_u8_str._M_string_length._0_1_ = 0;
  invalid_u8_str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_158 = "";
  fs::u8path((path *)local_e0,&u8_str);
  fs::path::utf8string_abi_cxx11_((string *)local_b8,(path *)local_e0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&invalid_u8_str,&local_160,0x16,1,2,pvVar4,"fs::u8path(u8_str).utf8string()",&u8_str,
             "u8_str");
  std::__cxx11::string::~string((string *)local_b8);
  std::filesystem::__cxx11::path::~path((path *)local_e0);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x17;
  file_01.m_begin = (iterator)&local_170;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
             msg_01);
  invalid_u8_str._M_string_length._0_1_ = 0;
  invalid_u8_str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_188 = "";
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)local_e0,&str8,auto_format);
  fs::path::utf8string_abi_cxx11_((string *)local_b8,(path *)local_e0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&invalid_u8_str,&local_190,0x17,1,2,pvVar4,"fs::path(str8).utf8string()",&u8_str,
             "u8_str");
  std::__cxx11::string::~string((string *)local_b8);
  std::filesystem::__cxx11::path::~path((path *)local_e0);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x18;
  file_02.m_begin = (iterator)&local_1a0;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
             msg_02);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)local_e0,&str8,auto_format);
  std::filesystem::__cxx11::path::u8string_abi___u8_((u8string *)&invalid_u8_str,(path *)local_e0);
  _cVar5 = 0x333025;
  bVar2 = std::operator==((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                           *)&invalid_u8_str,&str8);
  local_100._M_dataplus._M_p._0_4_ = CONCAT31(local_100._M_dataplus._M_p._1_3_,bVar2);
  local_100._M_string_length = 0;
  local_100.field_2._M_allocated_capacity = 0;
  local_a0 = &local_1c0;
  local_1c0 = "fs::path(str8).u8string() == str8";
  local_1b8 = "";
  local_b8[8] = false;
  local_b8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_1c8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_100,(lazy_ostream *)local_b8,1,0,WARN,_cVar5,
             (size_t)&local_1d0,0x18);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_100.field_2._M_allocated_capacity);
  std::__cxx11::u8string::~u8string((u8string *)&invalid_u8_str);
  std::filesystem::__cxx11::path::~path((path *)local_e0);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x19;
  file_03.m_begin = (iterator)&local_1e0;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f0,
             msg_03);
  invalid_u8_str._M_string_length._0_1_ = 0;
  invalid_u8_str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_1f8 = "";
  fs::PathFromString((path *)local_e0,&u8_str);
  fs::path::utf8string_abi_cxx11_((string *)local_b8,(path *)local_e0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&invalid_u8_str,&local_200,0x19,1,2,pvVar4,"fs::PathFromString(u8_str).utf8string()",
             &u8_str,"u8_str");
  std::__cxx11::string::~string((string *)local_b8);
  std::filesystem::__cxx11::path::~path((path *)local_e0);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = &DAT_0000001a;
  file_04.m_begin = (iterator)&local_210;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_220,
             msg_04);
  invalid_u8_str._M_string_length._0_1_ = 0;
  invalid_u8_str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_228 = "";
  fs::u8path((path *)local_e0,&u8_str);
  std::filesystem::__cxx11::path::string((string *)local_b8,(path *)local_e0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&invalid_u8_str,&local_230,0x1a,1,2,pvVar4,"fs::PathToString(fs::u8path(u8_str))",
             &u8_str,"u8_str");
  std::__cxx11::string::~string((string *)local_b8);
  std::filesystem::__cxx11::path::~path((path *)local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_u8_str,anon_var_dwarf_6e3850,(allocator<char> *)local_e0);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x23;
  file_05.m_begin = (iterator)&local_240;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_250,
             msg_05);
  local_e0[8] = 0;
  local_e0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_e0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_e0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_258 = "";
  local_b8._0_8_ =
       CONCAT71(invalid_u8_str._M_string_length._1_7_,(undefined1)invalid_u8_str._M_string_length);
  pvVar4 = local_b8;
  local_100._M_dataplus._M_p._0_4_ = 1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (local_e0,&local_260,0x23,1,2,pvVar4,"invalid_u8_str.size()",&local_100,"1");
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x24;
  file_06.m_begin = (iterator)&local_270;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_280,
             msg_06);
  local_b8[8] = false;
  local_b8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_288 = "";
  fs::PathFromString((path *)local_e0,&invalid_u8_str);
  std::filesystem::__cxx11::path::string(&local_100,(path *)local_e0);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_b8,&local_290,0x24,1,2,&local_100,
             "fs::PathToString(fs::PathFromString(invalid_u8_str))",&invalid_u8_str,"invalid_u8_str"
            );
  std::__cxx11::string::~string((string *)&local_100);
  std::filesystem::__cxx11::path::~path((path *)local_e0);
  std::__cxx11::string::~string((string *)&invalid_u8_str);
  std::__cxx11::u8string::~u8string((u8string *)&str8);
  std::__cxx11::string::~string((string *)&u8_str);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_pathtostring)
{
    std::string u8_str = "fs_tests_₿_🏃";
    std::u8string str8{u8"fs_tests_₿_🏃"};
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(u8_str)), u8_str);
    BOOST_CHECK_EQUAL(fs::u8path(u8_str).utf8string(), u8_str);
    BOOST_CHECK_EQUAL(fs::path(str8).utf8string(), u8_str);
    BOOST_CHECK(fs::path(str8).u8string() == str8);
    BOOST_CHECK_EQUAL(fs::PathFromString(u8_str).utf8string(), u8_str);
    BOOST_CHECK_EQUAL(fs::PathToString(fs::u8path(u8_str)), u8_str);
#ifndef WIN32
    // On non-windows systems, verify that arbitrary byte strings containing
    // invalid UTF-8 can be round tripped successfully with PathToString and
    // PathFromString. On non-windows systems, paths are just byte strings so
    // these functions do not do any encoding. On windows, paths are Unicode,
    // and these functions do encoding and decoding, so the behavior of this
    // test would be undefined.
    std::string invalid_u8_str = "\xf0";
    BOOST_CHECK_EQUAL(invalid_u8_str.size(), 1);
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(invalid_u8_str)), invalid_u8_str);
#endif
}